

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall
SimpleAsciiFixture_IndexCStr_Test::SimpleAsciiFixture_IndexCStr_Test
          (SimpleAsciiFixture_IndexCStr_Test *this)

{
  SimpleAsciiFixture_IndexCStr_Test *this_local;
  
  anon_unknown.dwarf_d9fbb::SimpleAsciiFixture::SimpleAsciiFixture(&this->super_SimpleAsciiFixture);
  (this->super_SimpleAsciiFixture).super_Test._vptr_Test =
       (_func_int **)&PTR__SimpleAsciiFixture_IndexCStr_Test_00322650;
  return;
}

Assistant:

TEST_F (SimpleAsciiFixture, IndexCStr) {
    char const * strz = str.c_str ();
    ASSERT_EQ (strz + 0, pstore::utf::index (strz, 0));
    ASSERT_EQ (strz + 1, pstore::utf::index (strz, 1));
    ASSERT_EQ (strz + 2, pstore::utf::index (strz, 2));
    ASSERT_EQ (strz + 3, pstore::utf::index (strz, 3));
    ASSERT_EQ (strz + 4, pstore::utf::index (strz, 4));
    ASSERT_EQ (strz + 5, pstore::utf::index (strz, 5));
    ASSERT_EQ (strz + 6, pstore::utf::index (strz, 6));
    ASSERT_EQ (strz + 7, pstore::utf::index (strz, 7));
    ASSERT_EQ (strz + 8, pstore::utf::index (strz, 8));
    ASSERT_EQ (nullptr, pstore::utf::index (strz, 9));
    ASSERT_EQ (nullptr, pstore::utf::index (strz, std::numeric_limits<std::size_t>::max ()));
}